

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

void encodeTriple(char *result,int difx,int dify)

{
  ulong uVar1;
  int iVar2;
  
  if (dify < 0x88) {
    *result = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(long)(difx / 0x1c) + (long)(dify / 0x22) * 6];
    result[3] = '\0';
    uVar1 = 3;
    iVar2 = dify % 0x22 + (difx % 0x1c) * 0x22;
    do {
      result[uVar1 - 1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar2 % 0x1f];
      uVar1 = uVar1 - 1;
      iVar2 = iVar2 / 0x1f;
    } while (1 < uVar1);
  }
  else {
    *result = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(long)(difx / 0x18) + 0x18];
    result[3] = '\0';
    uVar1 = 3;
    iVar2 = dify + (difx % 0x18) * 0x28 + -0x88;
    do {
      result[uVar1 - 1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar2 % 0x1f];
      uVar1 = uVar1 - 1;
      iVar2 = iVar2 / 0x1f;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

static void encodeTriple(char *result, const int difx, const int dify) {
    ASSERT(result);
    if (dify < 4 * 34) // first 4(x34) rows of 6(x28) wide
    {
        *result = ENCODE_CHARS[((difx / 28) + 6 * (dify / 34))];
        encodeBase31(result + 1, ((difx % 28) * 34 + (dify % 34)), 2);
    } else // bottom row
    {
        *result = ENCODE_CHARS[(difx / 24) + 24];
        encodeBase31(result + 1, (difx % 24) * 40 + (dify - 136), 2);
    }
}